

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint32_t __thiscall GmmLib::GmmResourceInfoCommon::GetQPitch(GmmResourceInfoCommon *this)

{
  GMM_TILE_MODE GVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  GMM_PLATFORM_INFO *pGVar5;
  undefined4 extraout_var_00;
  uint uVar6;
  uint32_t local_1c;
  GMM_TILE_MODE TileMode;
  uint32_t QPitch;
  GMM_PLATFORM_INFO *pPlatform;
  GmmResourceInfoCommon *this_local;
  
  iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pGVar5 = GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar3));
  if (0xb < (int)(pGVar5->Platform).eRenderCoreFamily) {
    iVar3 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    uVar2 = GmmIsCompressed((void *)CONCAT44(extraout_var_00,iVar3),(this->Surf).Format);
    if (uVar2 != '\0') {
      uVar6 = (this->Surf).Alignment.QPitch;
      uVar4 = (*this->_vptr_GmmResourceInfoCommon[0x7d])();
      uVar6 = uVar6 / uVar4;
      if ((this->Surf).Type != RESOURCE_3D) {
        return uVar6;
      }
      if (((ulong)(this->Surf).Flags.Info >> 0x13 & 1) != 0) {
        return uVar6;
      }
      GVar1 = (this->Surf).TileMode;
      return (uVar6 + (pGVar5->TileInfo[GVar1].LogicalTileHeight - 1)) -
             (uVar6 + (pGVar5->TileInfo[GVar1].LogicalTileHeight - 1) &
             pGVar5->TileInfo[GVar1].LogicalTileHeight - 1);
    }
  }
  if (((ulong)(this->Surf).Flags.Gpu >> 10 & 1) == 0) {
    local_1c = (this->Surf).Alignment.QPitch;
  }
  else {
    local_1c = (this->Surf).Alignment.QPitch * (uint)pGVar5->HiZPixelsPerByte;
  }
  return local_1c;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetQPitch()
{
    const GMM_PLATFORM_INFO *pPlatform;
    uint32_t                 QPitch;

    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());

    __GMM_ASSERT(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE);
    __GMM_ASSERT((Surf.Type != RESOURCE_3D) ||
                 (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE));

    // 2D/CUBE    ==> distance in rows between array slices
    // 3D         ==> distance in rows between R-slices
    // Compressed ==> one row contains a complete compression block vertically
    // HiZ        ==> HZ_PxPerByte * HZ_QPitch
    // Stencil    ==> logical, i.e. not halved

    if((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE) &&
       GmmIsCompressed(GetGmmLibContext(), Surf.Format))
    {
        QPitch = Surf.Alignment.QPitch / GetCompressionBlockHeight();

        if((Surf.Type == RESOURCE_3D) && !Surf.Flags.Info.Linear)
        {
            const GMM_TILE_MODE TileMode = Surf.TileMode;
            __GMM_ASSERT(TileMode < GMM_TILE_MODES);
            QPitch = GFX_ALIGN(QPitch, pPlatform->TileInfo[TileMode].LogicalTileHeight);
        }
    }
    else if(Surf.Flags.Gpu.HiZ)
    {
        QPitch = Surf.Alignment.QPitch * pPlatform->HiZPixelsPerByte;
    }
    else
    {
        QPitch = Surf.Alignment.QPitch;
    }

    return QPitch;
}